

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_to_hex.hpp
# Opt level: O3

char * mserialize::detail::write_integer_as_hex<long>(long v,char *end)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  
  if (v == 0) {
    end[-1] = '0';
    return end + -1;
  }
  if (v < 1) {
    pcVar2 = end + -1;
    do {
      uVar1 = v + 0xf;
      uVar3 = v;
      if (v < 0) {
        uVar3 = uVar1;
      }
      *pcVar2 = "0123456789ABCDEF"[(uVar3 & 0xfffffffffffffff0) - v];
      v = (long)uVar3 >> 4;
      pcVar2 = pcVar2 + -1;
    } while (0x1e < uVar1);
    *pcVar2 = '-';
    return pcVar2;
  }
  do {
    end[-1] = "0123456789ABCDEF"[(uint)v & 0xf];
    end = end + -1;
    bVar4 = 0xf < (ulong)v;
    v = (ulong)v >> 4;
  } while (bVar4);
  return end;
}

Assistant:

constexpr char* write_integer_as_hex(Integer v, char* end)
{
  const char digits[] = "0123456789ABCDEF";

  if (v == 0)
  {
    *--end = '0';
  }
  else if (v > 0)
  {
    while (v != 0)
    {
      *--end = digits[v % 16];
      v = static_cast<Integer>(v / 16);
    }
  }
  else
  {
    while (v != 0)
    {
      *--end = digits[-(v % 16)];
      v = static_cast<Integer>(v / 16);
    }
    *--end = '-';
  }

  return end;
}